

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GdlAttrValueSpec::FlattenPointSlotAttrs
          (GdlAttrValueSpec *this,GrcManager *pcman,
          vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *vpavsNew)

{
  pointer *pppGVar1;
  size_t sVar2;
  iterator __position;
  GrcSymbolTableEntry *pGVar3;
  bool bVar4;
  GdlExpression *pexpValue;
  Symbol this_00;
  bool bVar5;
  int iVar6;
  Symbol pGVar7;
  GdlAttrValueSpec *pGVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GdlExpression *pexpYoffset;
  GdlAttrValueSpec *pavs;
  GdlExpression *pexpXoffset;
  GdlExpression *pexpGpoint;
  GdlExpression *pexpY;
  int nTmp;
  GdlAttrValueSpec *local_298;
  GdlExpression *local_290;
  GdlExpression *local_288;
  GdlExpression *local_280;
  undefined1 local_278 [32];
  Symbol local_258;
  Symbol local_250;
  Symbol local_248;
  Symbol local_240;
  Symbol local_238;
  long *local_230;
  size_t local_228;
  long local_220 [2];
  long *local_210;
  size_t local_208;
  long local_200 [2];
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  string local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar5 = GrcSymbolTableEntry::IsBogusSlotAttr(this->m_psymName);
  if (bVar5) {
    pGVar7 = this->m_psymName;
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"xoffset","");
    sVar2 = (pGVar7->m_staFieldName)._M_string_length;
    if (sVar2 == local_208) {
      if (sVar2 == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp((pGVar7->m_staFieldName)._M_dataplus._M_p,local_210,sVar2);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
LAB_00130b39:
      iVar6 = (*this->m_pexpValue->_vptr_GdlExpression[7])(this->m_pexpValue,local_278,0);
      bVar4 = (bool)(bVar5 ^ 1);
      if ((char)iVar6 == '\0') {
        bVar5 = false;
      }
      else {
        bVar5 = local_278._0_4_ == 0;
      }
    }
    else {
      pGVar7 = this->m_psymName;
      local_230 = local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"yoffset","");
      sVar2 = (pGVar7->m_staFieldName)._M_string_length;
      bVar4 = true;
      if ((sVar2 == local_228) &&
         ((sVar2 == 0 ||
          (iVar6 = bcmp((pGVar7->m_staFieldName)._M_dataplus._M_p,local_230,sVar2), iVar6 == 0))))
      goto LAB_00130b39;
      bVar5 = false;
    }
    if ((bVar4) && (local_230 != local_220)) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (!bVar5) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"Invalid slot attribute: ","");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymName);
      GrcErrorList::AddItem
                (&g_errorList,true,0x1025,&this->super_GdlObject,(GrpLineAndFile *)0x0,&local_1b0,
                 &local_50,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                 (string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_1f0.field_2._0_8_ = local_1b0.field_2._0_8_;
      uVar11 = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
LAB_00130cb4:
        operator_delete((void *)uVar11,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    bVar5 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPtOff);
    if (((!bVar5) &&
        (bVar5 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPt), !bVar5)) ||
       (bVar5 = GrcSymbolTableEntry::IsReadOnlySlotAttr(this->m_psymName), bVar5)) {
      __position._M_current =
           (vpavsNew->super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (vpavsNew->super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = this;
        pppGVar1 = &(vpavsNew->
                    super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppGVar1 = *pppGVar1 + 1;
        return;
      }
      local_278._0_8_ = this;
      std::vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>>::
      _M_realloc_insert<GdlAttrValueSpec*>
                ((vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>> *)vpavsNew,__position,
                 (GdlAttrValueSpec **)local_278);
      return;
    }
    GrcSymbolTableEntry::FullName_abi_cxx11_((string *)local_278,this->m_psymOperator);
    iVar6 = std::__cxx11::string::compare((char *)local_278);
    if ((GdlExpression *)local_278._0_8_ != (GdlExpression *)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if (iVar6 != 0) {
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,
                 "Invalid point arithmetic; fields must be calculated independently in order to use "
                 ,"");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_70,this->m_psymOperator);
      GrcErrorList::AddItem
                (&g_errorList,true,0x1026,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                 (string *)&local_1d0,&local_70,(string *)0x0,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_allocated_capacity == &local_1c0) {
        return;
      }
      uVar10 = local_1c0._M_allocated_capacity + 1;
      this = (GdlAttrValueSpec *)local_1d0._M_allocated_capacity;
      goto LAB_00130ccc;
    }
    pGVar3 = this->m_psymName;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"x","");
    local_238 = GrcSymbolTableEntry::SubField(pGVar3,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    pGVar3 = this->m_psymName;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"y","");
    local_240 = GrcSymbolTableEntry::SubField(pGVar3,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pGVar3 = this->m_psymName;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"gpoint","");
    local_250 = GrcSymbolTableEntry::SubField(pGVar3,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    pGVar3 = this->m_psymName;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"xoffset","");
    local_248 = GrcSymbolTableEntry::SubField(pGVar3,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    pGVar3 = this->m_psymName;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"yoffset","");
    pGVar7 = GrcSymbolTableEntry::SubField(pGVar3,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPtOff);
    local_278._0_8_ = (GdlExpression *)0x0;
    local_280 = (GdlExpression *)0x0;
    local_288 = (GdlExpression *)0x0;
    local_290 = (GdlExpression *)0x0;
    iVar6 = (*this->m_pexpValue->_vptr_GdlExpression[0x14])(this->m_pexpValue,pcman);
    uVar11 = local_278._0_8_;
    if ((char)iVar6 == '\0') {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"Invalid point arithmetic","");
      GrcErrorList::AddError(&g_errorList,0x1027,&this->super_GdlObject,&local_1f0);
      uVar11 = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) goto LAB_00130cbc;
      goto LAB_00130cb4;
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_288;
    auVar15._8_8_ = local_280;
    auVar15._0_8_ = local_278._0_8_;
    auVar15 = auVar15 | auVar14;
    auVar13._0_4_ = -(uint)(auVar15._0_4_ == 0);
    auVar13._4_4_ = -(uint)(auVar15._4_4_ == 0);
    auVar13._8_4_ = -(uint)(auVar15._8_4_ == 0);
    auVar13._12_4_ = -(uint)(auVar15._12_4_ == 0);
    iVar6 = movmskps(iVar6,auVar13);
    local_258 = pGVar7;
    if (iVar6 == 0xf) {
      lVar9 = __dynamic_cast(this->m_pexpValue,&GdlExpression::typeinfo,
                             &GdlLookupExpression::typeinfo,0);
      bVar5 = GrcSymbolTableEntry::FitsSymbolType
                        (*(GrcSymbolTableEntry **)(lVar9 + 0x38),ksymtGlyphAttr);
      if (bVar5) {
        paVar12 = &local_160;
        local_170._M_allocated_capacity = (size_type)paVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"Glyph attribute is not a point: ","");
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_90,*(GrcSymbolTableEntry **)(lVar9 + 0x38));
        GrcErrorList::AddItem
                  (&g_errorList,true,0x1028,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                   (string *)&local_170,&local_90,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0,(string *)0x0,(string *)0x0);
        uVar11 = local_170._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          uVar11 = local_170._M_allocated_capacity;
        }
      }
      else {
        paVar12 = &local_180;
        local_190._M_allocated_capacity = (size_type)paVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"Undefined glyph attribute: ","");
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_b0,*(GrcSymbolTableEntry **)(lVar9 + 0x38));
        GrcErrorList::AddItem
                  (&g_errorList,true,0x1029,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                   (string *)&local_190,&local_b0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0,(string *)0x0,(string *)0x0);
        uVar11 = local_190._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          uVar11 = local_190._M_allocated_capacity;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar11 != paVar12) {
        local_1f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        goto LAB_00130cb4;
      }
    }
    else {
      if ((GdlExpression *)local_278._0_8_ != (GdlExpression *)0x0) {
        pGVar8 = (GdlAttrValueSpec *)operator_new(0x48);
        GdlAttrValueSpec(pGVar8,local_238,this->m_psymOperator,(GdlExpression *)uVar11);
        iVar6 = (this->super_GdlObject).m_lnf.m_nLineOrig;
        (pGVar8->super_GdlObject).m_lnf.m_nLinePre = (this->super_GdlObject).m_lnf.m_nLinePre;
        (pGVar8->super_GdlObject).m_lnf.m_nLineOrig = iVar6;
        local_298 = pGVar8;
        std::__cxx11::string::_M_assign((string *)&(pGVar8->super_GdlObject).m_lnf.m_staFile);
        local_298->m_fFlattened = true;
        std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                  (vpavsNew,&local_298);
      }
      pexpValue = local_280;
      if (local_280 != (GdlExpression *)0x0) {
        pGVar8 = (GdlAttrValueSpec *)operator_new(0x48);
        GdlAttrValueSpec(pGVar8,local_240,this->m_psymOperator,pexpValue);
        iVar6 = (this->super_GdlObject).m_lnf.m_nLineOrig;
        (pGVar8->super_GdlObject).m_lnf.m_nLinePre = (this->super_GdlObject).m_lnf.m_nLinePre;
        (pGVar8->super_GdlObject).m_lnf.m_nLineOrig = iVar6;
        local_298 = pGVar8;
        std::__cxx11::string::_M_assign((string *)&(pGVar8->super_GdlObject).m_lnf.m_staFile);
        local_298->m_fFlattened = true;
        std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                  (vpavsNew,&local_298);
      }
      this_00 = local_248;
      pGVar7 = local_250;
      if (g_cman.m_fOffsetAttrs == true) {
        if (local_288 != (GdlExpression *)0x0) {
          bVar5 = GrcSymbolTableEntry::IsBogusSlotAttr(local_250);
          if (bVar5) {
            if (local_288 != (GdlExpression *)0x0) {
              (*local_288->_vptr_GdlExpression[2])();
            }
          }
          else {
            pGVar8 = (GdlAttrValueSpec *)operator_new(0x48);
            GdlAttrValueSpec(pGVar8,pGVar7,this->m_psymOperator,local_288);
            iVar6 = (this->super_GdlObject).m_lnf.m_nLineOrig;
            (pGVar8->super_GdlObject).m_lnf.m_nLinePre = (this->super_GdlObject).m_lnf.m_nLinePre;
            (pGVar8->super_GdlObject).m_lnf.m_nLineOrig = iVar6;
            local_298 = pGVar8;
            std::__cxx11::string::_M_assign((string *)&(pGVar8->super_GdlObject).m_lnf.m_staFile);
            local_298->m_fFlattened = true;
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (vpavsNew,&local_298);
          }
        }
        if (local_290 != (GdlExpression *)0x0) {
          bVar5 = GrcSymbolTableEntry::IsBogusSlotAttr(this_00);
          if (bVar5) {
            if (local_290 != (GdlExpression *)0x0) {
              (*local_290->_vptr_GdlExpression[2])();
            }
          }
          else {
            pGVar8 = (GdlAttrValueSpec *)operator_new(0x48);
            GdlAttrValueSpec(pGVar8,this_00,this->m_psymOperator,local_290);
            iVar6 = (this->super_GdlObject).m_lnf.m_nLineOrig;
            (pGVar8->super_GdlObject).m_lnf.m_nLinePre = (this->super_GdlObject).m_lnf.m_nLinePre;
            (pGVar8->super_GdlObject).m_lnf.m_nLineOrig = iVar6;
            local_298 = pGVar8;
            std::__cxx11::string::_M_assign((string *)&(pGVar8->super_GdlObject).m_lnf.m_staFile);
            local_298->m_fFlattened = true;
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (vpavsNew,&local_298);
          }
        }
      }
      else {
        if (local_288 != (GdlExpression *)0x0) {
          (*local_288->_vptr_GdlExpression[2])();
        }
        if (local_290 != (GdlExpression *)0x0) {
          (*local_290->_vptr_GdlExpression[2])();
        }
      }
    }
  }
LAB_00130cbc:
  ~GdlAttrValueSpec(this);
  uVar10 = 0x48;
LAB_00130ccc:
  operator_delete(this,uVar10);
  return;
}

Assistant:

void GdlAttrValueSpec::FlattenPointSlotAttrs(GrcManager * pcman,
	std::vector<GdlAttrValueSpec *> & vpavsNew)
{
	if (m_psymName->IsBogusSlotAttr())	// eg, shift.gpath
	{
		int nTmp;
		if ((m_psymName->LastFieldIs("xoffset") || m_psymName->LastFieldIs("yoffset")) &&
			m_pexpValue->ResolveToInteger(&nTmp, false) && nTmp == 0)
		{	// ignore
		}
		else
			g_errorList.AddError(4133, this,
				"Invalid slot attribute: ",
				m_psymName->FullName());
		delete this;
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff)		// attach.at, shift, etc.
		|| m_psymName->FitsSymbolType(ksymtSlotAttrPt))			// collision.min/max
	{
		if (m_psymName->IsReadOnlySlotAttr())
		{
			//	Eventually will produce an error--for now, just pass through as is.
			vpavsNew.push_back(this);
			return;
		}

		if (m_psymOperator->FullName() != "=")
		{
			//	Can't use +=, -= with entire points.
			g_errorList.AddError(4134, this,
				"Invalid point arithmetic; fields must be calculated independently in order to use ",
				m_psymOperator->FullName());
			return;
		}

		Symbol psymX = m_psymName->SubField("x");
		Symbol psymY = m_psymName->SubField("y");
		Symbol psymGpoint = m_psymName->SubField("gpoint");
		Symbol psymXoffset = m_psymName->SubField("xoffset");
		Symbol psymYoffset = m_psymName->SubField("yoffset");
		Assert(psymX);
		Assert(psymY);
		if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff))
		{
			Assert(psymGpoint);
			Assert(psymXoffset);
			Assert(psymYoffset);
		}
		else
		{
			Assert(psymGpoint == NULL);
			Assert(psymXoffset == NULL);
			Assert(psymYoffset == NULL);
		}

		GdlExpression * pexpX = NULL;
		GdlExpression * pexpY = NULL;
		GdlExpression * pexpGpoint = NULL;
		GdlExpression * pexpXoffset = NULL;
		GdlExpression * pexpYoffset = NULL;

		bool fExpOkay = m_pexpValue->PointFieldEquivalents(pcman,
			&pexpX, &pexpY, &pexpGpoint, &pexpXoffset, &pexpYoffset);
		if (!fExpOkay)
		{
			g_errorList.AddError(4135, this,
				"Invalid point arithmetic");
			delete this;
			return;
		}
		else if (!pexpX && !pexpY && !pexpGpoint && !pexpYoffset && !pexpYoffset)
		{
			GdlLookupExpression * pexpLookup =
				dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			Assert(pexpLookup);
			if (pexpLookup->Name()->FitsSymbolType(ksymtGlyphAttr))
				g_errorList.AddError(4136, this,
					"Glyph attribute is not a point: ",
					pexpLookup->Name()->FullName());
			else
				g_errorList.AddError(4137, this,
					"Undefined glyph attribute: ",
					pexpLookup->Name()->FullName());
			delete this;
			return;
		}
		
		GdlAttrValueSpec * pavs;
		if (pexpX)
		{
			pavs = new GdlAttrValueSpec(psymX, m_psymOperator, pexpX);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (pexpY)
		{
			pavs = new GdlAttrValueSpec(psymY, m_psymOperator, pexpY);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (g_cman.OffsetAttrs())
		{
			if (pexpGpoint)
			{
				if (psymGpoint->IsBogusSlotAttr())
					delete pexpGpoint;
				else
				{
					pavs = new GdlAttrValueSpec(psymGpoint, m_psymOperator, pexpGpoint);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpXoffset)
			{
				if (psymXoffset->IsBogusSlotAttr())
					delete pexpXoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymXoffset, m_psymOperator, pexpXoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpYoffset)
			{
				if (psymYoffset->IsBogusSlotAttr())
					delete pexpYoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymYoffset, m_psymOperator, pexpYoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
		} else {
			if (pexpGpoint)
				delete pexpGpoint;
			if (pexpXoffset)
				delete pexpXoffset;
			if (pexpYoffset)
				delete pexpYoffset;
		}

		delete this;	// replaced
	}
	else
		vpavsNew.push_back(this);
}